

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wavelet.cpp
# Opt level: O1

void idx2::InverseCdf53(v3i *Dims3,v3i *M3,int Iter,int NLevels,u64 TformOrder,volume *Vol,
                       bool Normalize)

{
  array<idx2::subband> *paVar1;
  v3i *M;
  int iVar2;
  undefined1 *puVar3;
  char *__function;
  int iVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  u64 TransformOrder;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  grid *pgVar12;
  uint uVar13;
  double dVar14;
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  v3i R3;
  v3i D3;
  v3i S3;
  grid_iterator<signed_char> ItEnd;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_Wavelet_cpp:354:5)>
  __ScopeGuard__354;
  wav_basis_norms_static<16> BasisNorms;
  grid_iterator<double> local_5c0;
  double local_588;
  ulong local_580;
  uint local_578;
  ulong local_570;
  uint local_568;
  ulong local_564;
  uint local_55c;
  grid_iterator<double> local_558;
  array<idx2::subband> *local_520;
  char local_518;
  v3i *local_510;
  array<idx2::subband> local_508;
  undefined1 local_4d8 [32];
  undefined1 local_4b8 [32];
  undefined1 local_498 [32];
  undefined1 local_478 [32];
  undefined1 local_458;
  undefined1 local_448 [136];
  undefined1 local_3c0 [112];
  grid gStack_350;
  ulong local_338 [97];
  
  local_588 = (double)CONCAT44(local_588._4_4_,Iter);
  uVar13 = 0;
  local_510 = M3;
  memset(local_338,0,0x301);
  auVar15 = ZEXT816(0) << 0x40;
  local_478 = ZEXT1632(auVar15);
  local_498 = ZEXT1632(auVar15);
  local_4b8 = ZEXT1632(auVar15);
  local_4d8 = ZEXT1632(auVar15);
  local_458 = 0;
  local_568 = (Dims3->field_0).field_0.Z;
  local_570 = *(ulong *)&Dims3->field_0;
  local_578 = (Dims3->field_0).field_0.Z;
  local_580 = *(ulong *)&Dims3->field_0;
  local_564 = 0x100000001;
  local_55c = 1;
  TransformOrder = TformOrder;
  if (0 < NLevels) {
    uVar7 = (ulong)((Dims3->field_0).field_0.Z & 0x1fffff) << 0x2a |
            (ulong)(uint)(Dims3->field_0).field_0.X & 0x1fffff |
            ((ulong)(uint)(Dims3->field_0).field_0.Y & 0x1fffff) << 0x15;
    uVar6 = 0x40000200001;
    iVar4 = 0;
    uVar13 = 0;
    do {
      uVar10 = (uint)TransformOrder;
      uVar8 = uVar10 & 3;
      TransformOrder = TransformOrder >> 2;
      if (uVar8 == 3) {
        if (TransformOrder != 3) {
          TformOrder = TransformOrder;
        }
        uVar6 = (ulong)(local_55c & 0x1fffff) << 0x2a |
                (local_564 >> 0x20 & 0x1fffff) << 0x15 | local_564 & 0x1fffff;
        local_578 = local_568;
        uVar7 = (ulong)(local_568 & 0x1fffff) << 0x2a |
                (local_570 >> 0x20 & 0x1fffff) << 0x15 | local_570 & 0x1fffff;
        local_580 = local_570;
        iVar4 = iVar4 + 1;
        TransformOrder = TformOrder;
      }
      else {
        if (0x1f < (int)uVar13) {
          __function = 
          "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]";
          goto LAB_001a2532;
        }
        lVar9 = (long)(int)uVar13;
        local_338[lVar9 * 3] = 0;
        local_338[lVar9 * 3 + 1] = uVar7;
        local_338[lVar9 * 3 + 2] = uVar6;
        *(uint *)(local_4d8 + lVar9 * 4) = uVar8;
        uVar13 = uVar13 + 1;
        uVar11 = (ulong)((uVar10 & 3) << 2);
        uVar8 = *(uint *)((long)&local_570 + uVar11) | 1;
        *(uint *)((long)&local_580 + uVar11) = uVar8;
        uVar7 = (ulong)(local_578 & 0x1fffff) << 0x2a |
                (local_580 >> 0x20 & 0x1fffff) << 0x15 | local_580 & 0x1fffff;
        *(int *)((long)&local_570 + uVar11) = (int)(uVar8 + 1) >> 1;
        *(int *)((long)&local_564 + uVar11) = *(int *)((long)&local_564 + uVar11) << 1;
      }
    } while (iVar4 < NLevels);
  }
  if (Normalize && 0 < NLevels) {
    if (Mallocator()::Instance == '\0') {
      InverseCdf53();
    }
    if (Mallocator()::Instance == '\0') {
      InverseCdf53();
    }
    local_520 = &local_508;
    local_508.Buffer.Data = (byte *)0x0;
    local_508.Buffer.Bytes = 0;
    local_508.Buffer.Alloc = (allocator *)&Mallocator()::Instance;
    local_508.Size = 0;
    local_508.Capacity = 0;
    local_508.Alloc = (allocator *)&Mallocator()::Instance;
    local_518 = '\0';
    BuildSubbands(Dims3,NLevels,TransformOrder,local_520);
    GetCdf53NormsFast<16>();
    if (0 < local_508.Size) {
      iVar4 = NLevels * local_588._0_4_;
      lVar9 = 0;
      do {
        dVar14 = 1.0;
        pgVar12 = (grid *)(local_508.Buffer.Data + lVar9 * 0x40);
        if ((Dims3->field_0).field_0.X != 1) {
          iVar2 = (int)*(char *)((long)&pgVar12[2].super_extent.From + 3);
          if (*(char *)((long)&pgVar12[2].super_extent.From + 6) == '\0') {
            iVar2 = iVar2 + iVar4;
            if (iVar2 < 0x11) {
              iVar2 = iVar2 + -1;
              puVar3 = local_448;
              goto LAB_001a1adf;
            }
          }
          else {
            iVar2 = iVar2 + iVar4;
            puVar3 = local_3c0;
            if (iVar2 < 0x10) {
LAB_001a1adf:
              dVar14 = *(double *)(puVar3 + (long)iVar2 * 8);
              goto LAB_001a1ae6;
            }
          }
          goto LAB_001a2506;
        }
LAB_001a1ae6:
        dVar16 = 1.0;
        if ((Dims3->field_0).field_0.Y != 1) {
          iVar2 = (int)*(char *)((long)&pgVar12[2].super_extent.From + 4);
          if (*(char *)((long)&pgVar12[2].super_extent.From + 7) == '\0') {
            iVar2 = iVar2 + iVar4;
            if (iVar2 < 0x11) {
              iVar2 = iVar2 + -1;
              puVar3 = local_448;
              goto LAB_001a1b2a;
            }
          }
          else {
            iVar2 = iVar2 + iVar4;
            puVar3 = local_3c0;
            if (iVar2 < 0x10) {
LAB_001a1b2a:
              dVar16 = *(double *)(puVar3 + (long)iVar2 * 8);
              goto LAB_001a1b31;
            }
          }
          goto LAB_001a2506;
        }
LAB_001a1b31:
        dVar17 = 1.0;
        if ((Dims3->field_0).field_0.Z != 1) {
          iVar2 = (int)*(char *)((long)&pgVar12[2].super_extent.From + 5);
          if ((char)pgVar12[2].super_extent.Dims == '\0') {
            iVar2 = iVar2 + iVar4;
            if (iVar2 < 0x11) {
              iVar2 = iVar2 + -1;
              puVar3 = local_448;
              goto LAB_001a1b75;
            }
          }
          else {
            iVar2 = iVar2 + iVar4;
            puVar3 = local_3c0;
            if (iVar2 < 0x10) {
LAB_001a1b75:
              dVar17 = *(double *)(puVar3 + (long)iVar2 * 8);
              goto LAB_001a1b7c;
            }
          }
LAB_001a2506:
          __function = 
          "t &idx2::stack_array<double, 16>::operator[](int) const [t = double, N = 16]";
          goto LAB_001a2532;
        }
LAB_001a1b7c:
        if (Vol->Type < __Invalid__) {
          local_588 = 1.0 / (dVar14 * dVar16 * dVar17);
          switch(Vol->Type) {
          case int8:
            End<signed_char>((grid_iterator<signed_char> *)&local_558,pgVar12,Vol);
            Begin<signed_char>((grid_iterator<signed_char> *)&local_5c0,pgVar12,Vol);
            while (local_5c0.Ptr != local_558.Ptr) {
              *(char *)local_5c0.Ptr = (char)(int)((double)(int)*(char *)local_5c0.Ptr * local_588);
              local_5c0.P.field_0.field_0.X =
                   local_5c0.P.field_0.field_0.X + local_5c0.S.field_0.field_0.X;
              local_5c0.Ptr = (double *)((long)local_5c0.S.field_0.field_0.X + (long)local_5c0.Ptr);
              if (local_5c0.D.field_0.field_0.X <= local_5c0.P.field_0.field_0.X) {
                local_5c0.P.field_0.field_0.X = 0;
                local_5c0.P.field_0.field_0.Y =
                     local_5c0.P.field_0.field_0.Y + local_5c0.S.field_0.field_0.Y;
                lVar5 = (long)local_5c0.N.field_0.field_0.X;
                local_5c0.Ptr =
                     (double *)
                     ((long)local_5c0.Ptr +
                     (local_5c0.S.field_0.field_0.Y * lVar5 - (long)local_5c0.D.field_0.field_0.X));
                if (local_5c0.D.field_0.field_0.Y <= local_5c0.P.field_0.field_0.Y) {
                  local_5c0.P.field_0.field_0.Y = 0;
                  local_5c0.P.field_0.field_0.Z =
                       local_5c0.P.field_0.field_0.Z + local_5c0.S.field_0.field_0.Z;
                  local_5c0.Ptr =
                       (double *)
                       ((long)local_5c0.Ptr +
                       ((long)local_5c0.N.field_0.field_0.Y * local_5c0.S.field_0.field_0.Z * lVar5
                       - local_5c0.D.field_0.field_0.Y * lVar5));
                }
              }
            }
            break;
          case uint8:
            End<unsigned_char>((grid_iterator<unsigned_char> *)&local_558,pgVar12,Vol);
            Begin<unsigned_char>((grid_iterator<unsigned_char> *)&local_5c0,pgVar12,Vol);
            while (local_5c0.Ptr != local_558.Ptr) {
              *(char *)local_5c0.Ptr = (char)(int)((double)*(byte *)local_5c0.Ptr * local_588);
              local_5c0.P.field_0.field_0.X =
                   local_5c0.P.field_0.field_0.X + local_5c0.S.field_0.field_0.X;
              local_5c0.Ptr = (double *)((long)local_5c0.S.field_0.field_0.X + (long)local_5c0.Ptr);
              if (local_5c0.D.field_0.field_0.X <= local_5c0.P.field_0.field_0.X) {
                local_5c0.P.field_0.field_0.X = 0;
                local_5c0.P.field_0.field_0.Y =
                     local_5c0.P.field_0.field_0.Y + local_5c0.S.field_0.field_0.Y;
                lVar5 = (long)local_5c0.N.field_0.field_0.X;
                local_5c0.Ptr =
                     (double *)
                     ((long)local_5c0.Ptr +
                     (local_5c0.S.field_0.field_0.Y * lVar5 - (long)local_5c0.D.field_0.field_0.X));
                if (local_5c0.D.field_0.field_0.Y <= local_5c0.P.field_0.field_0.Y) {
                  local_5c0.P.field_0.field_0.Y = 0;
                  local_5c0.P.field_0.field_0.Z =
                       local_5c0.P.field_0.field_0.Z + local_5c0.S.field_0.field_0.Z;
                  local_5c0.Ptr =
                       (double *)
                       ((long)local_5c0.Ptr +
                       ((long)local_5c0.N.field_0.field_0.Y * local_5c0.S.field_0.field_0.Z * lVar5
                       - local_5c0.D.field_0.field_0.Y * lVar5));
                }
              }
            }
            break;
          case int16:
            End<short>((grid_iterator<short> *)&local_558,pgVar12,Vol);
            Begin<short>((grid_iterator<short> *)&local_5c0,pgVar12,Vol);
            while (local_5c0.Ptr != local_558.Ptr) {
              *(short *)local_5c0.Ptr =
                   (short)(int)((double)(int)*(short *)local_5c0.Ptr * local_588);
              local_5c0.P.field_0.field_0.X =
                   local_5c0.P.field_0.field_0.X + local_5c0.S.field_0.field_0.X;
              local_5c0.Ptr =
                   (double *)((long)local_5c0.Ptr + (long)local_5c0.S.field_0.field_0.X * 2);
              if (local_5c0.D.field_0.field_0.X <= local_5c0.P.field_0.field_0.X) {
                local_5c0.P.field_0.field_0.X = 0;
                local_5c0.P.field_0.field_0.Y =
                     local_5c0.P.field_0.field_0.Y + local_5c0.S.field_0.field_0.Y;
                lVar5 = (long)local_5c0.N.field_0.field_0.X;
                local_5c0.Ptr =
                     (double *)
                     ((long)local_5c0.Ptr +
                     local_5c0.S.field_0.field_0.Y * lVar5 * 2 +
                     (long)local_5c0.D.field_0.field_0.X * -2);
                if (local_5c0.D.field_0.field_0.Y <= local_5c0.P.field_0.field_0.Y) {
                  local_5c0.P.field_0.field_0.Y = 0;
                  local_5c0.P.field_0.field_0.Z =
                       local_5c0.P.field_0.field_0.Z + local_5c0.S.field_0.field_0.Z;
                  local_5c0.Ptr =
                       (double *)
                       ((long)local_5c0.Ptr +
                       (long)local_5c0.N.field_0.field_0.Y * local_5c0.S.field_0.field_0.Z * lVar5 *
                       2 + local_5c0.D.field_0.field_0.Y * lVar5 * -2);
                }
              }
            }
            break;
          case uint16:
            End<unsigned_short>((grid_iterator<unsigned_short> *)&local_558,pgVar12,Vol);
            Begin<unsigned_short>((grid_iterator<unsigned_short> *)&local_5c0,pgVar12,Vol);
            while (local_5c0.Ptr != local_558.Ptr) {
              *(short *)local_5c0.Ptr = (short)(int)((double)*(ushort *)local_5c0.Ptr * local_588);
              local_5c0.P.field_0.field_0.X =
                   local_5c0.P.field_0.field_0.X + local_5c0.S.field_0.field_0.X;
              local_5c0.Ptr =
                   (double *)((long)local_5c0.Ptr + (long)local_5c0.S.field_0.field_0.X * 2);
              if (local_5c0.D.field_0.field_0.X <= local_5c0.P.field_0.field_0.X) {
                local_5c0.P.field_0.field_0.X = 0;
                local_5c0.P.field_0.field_0.Y =
                     local_5c0.P.field_0.field_0.Y + local_5c0.S.field_0.field_0.Y;
                lVar5 = (long)local_5c0.N.field_0.field_0.X;
                local_5c0.Ptr =
                     (double *)
                     ((long)local_5c0.Ptr +
                     local_5c0.S.field_0.field_0.Y * lVar5 * 2 +
                     (long)local_5c0.D.field_0.field_0.X * -2);
                if (local_5c0.D.field_0.field_0.Y <= local_5c0.P.field_0.field_0.Y) {
                  local_5c0.P.field_0.field_0.Y = 0;
                  local_5c0.P.field_0.field_0.Z =
                       local_5c0.P.field_0.field_0.Z + local_5c0.S.field_0.field_0.Z;
                  local_5c0.Ptr =
                       (double *)
                       ((long)local_5c0.Ptr +
                       (long)local_5c0.N.field_0.field_0.Y * local_5c0.S.field_0.field_0.Z * lVar5 *
                       2 + local_5c0.D.field_0.field_0.Y * lVar5 * -2);
                }
              }
            }
            break;
          case int32:
            End<int>((grid_iterator<int> *)&local_558,pgVar12,Vol);
            Begin<int>((grid_iterator<int> *)&local_5c0,pgVar12,Vol);
            while (local_5c0.Ptr != local_558.Ptr) {
              *(int *)local_5c0.Ptr = (int)((double)(int)*(float *)local_5c0.Ptr * local_588);
              local_5c0.P.field_0.field_0.X =
                   local_5c0.P.field_0.field_0.X + local_5c0.S.field_0.field_0.X;
              local_5c0.Ptr =
                   (double *)((long)local_5c0.Ptr + (long)local_5c0.S.field_0.field_0.X * 4);
              if (local_5c0.D.field_0.field_0.X <= local_5c0.P.field_0.field_0.X) {
                local_5c0.P.field_0.field_0.X = 0;
                local_5c0.P.field_0.field_0.Y =
                     local_5c0.P.field_0.field_0.Y + local_5c0.S.field_0.field_0.Y;
                lVar5 = (long)local_5c0.N.field_0.field_0.X;
                local_5c0.Ptr =
                     (double *)
                     ((long)local_5c0.Ptr +
                     local_5c0.S.field_0.field_0.Y * lVar5 * 4 +
                     (long)local_5c0.D.field_0.field_0.X * -4);
                if (local_5c0.D.field_0.field_0.Y <= local_5c0.P.field_0.field_0.Y) {
                  local_5c0.P.field_0.field_0.Y = 0;
                  local_5c0.P.field_0.field_0.Z =
                       local_5c0.P.field_0.field_0.Z + local_5c0.S.field_0.field_0.Z;
                  local_5c0.Ptr =
                       (double *)
                       ((long)local_5c0.Ptr +
                       (long)local_5c0.N.field_0.field_0.Y * local_5c0.S.field_0.field_0.Z * lVar5 *
                       4 + local_5c0.D.field_0.field_0.Y * lVar5 * -4);
                }
              }
            }
            break;
          case uint32:
            End<unsigned_int>((grid_iterator<unsigned_int> *)&local_558,pgVar12,Vol);
            Begin<unsigned_int>((grid_iterator<unsigned_int> *)&local_5c0,pgVar12,Vol);
            while (local_5c0.Ptr != local_558.Ptr) {
              *(float *)local_5c0.Ptr =
                   (float)(long)((double)(uint)*(float *)local_5c0.Ptr * local_588);
              local_5c0.P.field_0.field_0.X =
                   local_5c0.P.field_0.field_0.X + local_5c0.S.field_0.field_0.X;
              local_5c0.Ptr =
                   (double *)((long)local_5c0.Ptr + (long)local_5c0.S.field_0.field_0.X * 4);
              if (local_5c0.D.field_0.field_0.X <= local_5c0.P.field_0.field_0.X) {
                local_5c0.P.field_0.field_0.X = 0;
                local_5c0.P.field_0.field_0.Y =
                     local_5c0.P.field_0.field_0.Y + local_5c0.S.field_0.field_0.Y;
                lVar5 = (long)local_5c0.N.field_0.field_0.X;
                local_5c0.Ptr =
                     (double *)
                     ((long)local_5c0.Ptr +
                     local_5c0.S.field_0.field_0.Y * lVar5 * 4 +
                     (long)local_5c0.D.field_0.field_0.X * -4);
                if (local_5c0.D.field_0.field_0.Y <= local_5c0.P.field_0.field_0.Y) {
                  local_5c0.P.field_0.field_0.Y = 0;
                  local_5c0.P.field_0.field_0.Z =
                       local_5c0.P.field_0.field_0.Z + local_5c0.S.field_0.field_0.Z;
                  local_5c0.Ptr =
                       (double *)
                       ((long)local_5c0.Ptr +
                       (long)local_5c0.N.field_0.field_0.Y * local_5c0.S.field_0.field_0.Z * lVar5 *
                       4 + local_5c0.D.field_0.field_0.Y * lVar5 * -4);
                }
              }
            }
            break;
          case int64:
            End<long>((grid_iterator<long> *)&local_558,pgVar12,Vol);
            Begin<long>((grid_iterator<long> *)&local_5c0,pgVar12,Vol);
            while (local_5c0.Ptr != local_558.Ptr) {
              *local_5c0.Ptr = (double)(long)((double)(long)*local_5c0.Ptr * local_588);
              local_5c0.P.field_0.field_0.X =
                   local_5c0.P.field_0.field_0.X + local_5c0.S.field_0.field_0.X;
              local_5c0.Ptr = local_5c0.Ptr + local_5c0.S.field_0.field_0.X;
              if (local_5c0.D.field_0.field_0.X <= local_5c0.P.field_0.field_0.X) {
                local_5c0.P.field_0.field_0.X = 0;
                local_5c0.P.field_0.field_0.Y =
                     local_5c0.P.field_0.field_0.Y + local_5c0.S.field_0.field_0.Y;
                lVar5 = (long)local_5c0.N.field_0.field_0.X;
                local_5c0.Ptr =
                     local_5c0.Ptr +
                     (local_5c0.S.field_0.field_0.Y * lVar5 - (long)local_5c0.D.field_0.field_0.X);
                if (local_5c0.D.field_0.field_0.Y <= local_5c0.P.field_0.field_0.Y) {
                  local_5c0.P.field_0.field_0.Y = 0;
                  local_5c0.P.field_0.field_0.Z =
                       local_5c0.P.field_0.field_0.Z + local_5c0.S.field_0.field_0.Z;
                  local_5c0.Ptr =
                       local_5c0.Ptr +
                       ((long)local_5c0.N.field_0.field_0.Y * local_5c0.S.field_0.field_0.Z * lVar5
                       - local_5c0.D.field_0.field_0.Y * lVar5);
                }
              }
            }
            break;
          case uint64:
            End<unsigned_long>((grid_iterator<unsigned_long> *)&local_558,pgVar12,Vol);
            Begin<unsigned_long>((grid_iterator<unsigned_long> *)&local_5c0,pgVar12,Vol);
            while (local_5c0.Ptr != local_558.Ptr) {
              auVar15._8_8_ = 0;
              auVar15._0_8_ = *local_5c0.Ptr;
              auVar15 = vunpcklps_avx(auVar15,_DAT_001bdf10);
              auVar15 = vsubpd_avx(auVar15,_DAT_001bdf20);
              dVar14 = (auVar15._0_8_ + auVar15._8_8_) * local_588;
              uVar6 = (ulong)dVar14;
              *local_5c0.Ptr =
                   (double)((long)(dVar14 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6);
              local_5c0.P.field_0.field_0.X =
                   local_5c0.P.field_0.field_0.X + local_5c0.S.field_0.field_0.X;
              local_5c0.Ptr = local_5c0.Ptr + local_5c0.S.field_0.field_0.X;
              if (local_5c0.D.field_0.field_0.X <= local_5c0.P.field_0.field_0.X) {
                local_5c0.P.field_0.field_0.X = 0;
                local_5c0.P.field_0.field_0.Y =
                     local_5c0.P.field_0.field_0.Y + local_5c0.S.field_0.field_0.Y;
                lVar5 = (long)local_5c0.N.field_0.field_0.X;
                local_5c0.Ptr =
                     local_5c0.Ptr +
                     (local_5c0.S.field_0.field_0.Y * lVar5 - (long)local_5c0.D.field_0.field_0.X);
                if (local_5c0.D.field_0.field_0.Y <= local_5c0.P.field_0.field_0.Y) {
                  local_5c0.P.field_0.field_0.Y = 0;
                  local_5c0.P.field_0.field_0.Z =
                       local_5c0.P.field_0.field_0.Z + local_5c0.S.field_0.field_0.Z;
                  local_5c0.Ptr =
                       local_5c0.Ptr +
                       ((long)local_5c0.N.field_0.field_0.Y * local_5c0.S.field_0.field_0.Z * lVar5
                       - local_5c0.D.field_0.field_0.Y * lVar5);
                }
              }
            }
            break;
          case float32:
            End<float>((grid_iterator<float> *)&local_558,pgVar12,Vol);
            Begin<float>((grid_iterator<float> *)&local_5c0,pgVar12,Vol);
            while (local_5c0.Ptr != local_558.Ptr) {
              *(float *)local_5c0.Ptr = (float)((double)*(float *)local_5c0.Ptr * local_588);
              local_5c0.P.field_0.field_0.X =
                   local_5c0.P.field_0.field_0.X + local_5c0.S.field_0.field_0.X;
              local_5c0.Ptr =
                   (double *)((long)local_5c0.Ptr + (long)local_5c0.S.field_0.field_0.X * 4);
              if (local_5c0.D.field_0.field_0.X <= local_5c0.P.field_0.field_0.X) {
                local_5c0.P.field_0.field_0.X = 0;
                local_5c0.P.field_0.field_0.Y =
                     local_5c0.P.field_0.field_0.Y + local_5c0.S.field_0.field_0.Y;
                lVar5 = (long)local_5c0.N.field_0.field_0.X;
                local_5c0.Ptr =
                     (double *)
                     ((long)local_5c0.Ptr +
                     local_5c0.S.field_0.field_0.Y * lVar5 * 4 +
                     (long)local_5c0.D.field_0.field_0.X * -4);
                if (local_5c0.D.field_0.field_0.Y <= local_5c0.P.field_0.field_0.Y) {
                  local_5c0.P.field_0.field_0.Y = 0;
                  local_5c0.P.field_0.field_0.Z =
                       local_5c0.P.field_0.field_0.Z + local_5c0.S.field_0.field_0.Z;
                  local_5c0.Ptr =
                       (double *)
                       ((long)local_5c0.Ptr +
                       (long)local_5c0.N.field_0.field_0.Y * local_5c0.S.field_0.field_0.Z * lVar5 *
                       4 + local_5c0.D.field_0.field_0.Y * lVar5 * -4);
                }
              }
            }
            break;
          case float64:
            End<double>(&local_558,pgVar12,Vol);
            Begin<double>(&local_5c0,pgVar12,Vol);
            while (local_5c0.Ptr != local_558.Ptr) {
              *local_5c0.Ptr = local_588 * *local_5c0.Ptr;
              local_5c0.P.field_0.field_0.X =
                   local_5c0.P.field_0.field_0.X + local_5c0.S.field_0.field_0.X;
              local_5c0.Ptr = local_5c0.Ptr + local_5c0.S.field_0.field_0.X;
              if (local_5c0.D.field_0.field_0.X <= local_5c0.P.field_0.field_0.X) {
                local_5c0.P.field_0.field_0.X = 0;
                local_5c0.P.field_0.field_0.Y =
                     local_5c0.P.field_0.field_0.Y + local_5c0.S.field_0.field_0.Y;
                lVar5 = (long)local_5c0.N.field_0.field_0.X;
                local_5c0.Ptr =
                     local_5c0.Ptr +
                     (local_5c0.S.field_0.field_0.Y * lVar5 - (long)local_5c0.D.field_0.field_0.X);
                if (local_5c0.D.field_0.field_0.Y <= local_5c0.P.field_0.field_0.Y) {
                  local_5c0.P.field_0.field_0.Y = 0;
                  local_5c0.P.field_0.field_0.Z =
                       local_5c0.P.field_0.field_0.Z + local_5c0.S.field_0.field_0.Z;
                  local_5c0.Ptr =
                       local_5c0.Ptr +
                       ((long)local_5c0.N.field_0.field_0.Y * local_5c0.S.field_0.field_0.Z * lVar5
                       - local_5c0.D.field_0.field_0.Y * lVar5);
                }
              }
            }
          }
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < local_508.Size);
    }
    paVar1 = local_520;
    if (local_518 == '\0') {
      (*local_520->Alloc->_vptr_allocator[1])(local_520->Alloc,local_520);
      paVar1->Size = 0;
      paVar1->Capacity = 0;
    }
  }
  M = local_510;
  if (0 < (int)uVar13) {
    lVar9 = (ulong)uVar13 + 1;
    pgVar12 = &gStack_350 + uVar13;
    do {
      if (0x20 < (int)uVar13) {
        __function = "t &idx2::stack_array<int, 32>::operator[](int) const [t = int, N = 32]";
LAB_001a2532:
        __assert_fail("Idx < N",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                      ,0x20c,__function);
      }
      if (Vol->Type < __Invalid__) {
        iVar4 = *(int *)(local_4d8 + lVar9 * 4 + -8);
        if (iVar4 == 2) {
          ILiftCdf53Z<double>(pgVar12,M,Normal,Vol);
        }
        else if (iVar4 == 1) {
          ILiftCdf53Y<double>(pgVar12,M,Normal,Vol);
        }
        else if (iVar4 == 0) {
          ILiftCdf53X<double>(pgVar12,M,Normal,Vol);
        }
      }
      lVar9 = lVar9 + -1;
      pgVar12 = pgVar12 + -1;
    } while (1 < lVar9);
  }
  return;
}

Assistant:

void
InverseCdf53(const v3i& Dims3,
             const v3i& M3,
             int Iter,
             int NLevels,
             u64 TformOrder,
             volume* Vol,
             bool Normalize)
{
  idx2_Assert(Dims3 <= Dims(*Vol));
  /* "simulate" the forward transform */
  stack_array<grid, 32> StackGrids;
  stack_array<int, 32> StackAxes;
  int Level = 0;
  u64 PrevOrder = TformOrder;
  v3i D3 = Dims3;
  v3i R3 = D3;
  v3i S3(1);
  grid G(Dims3);
  int Iteration = 0;
  while (Level < NLevels)
  {
    idx2_Assert(TformOrder != 0);
    int D = TformOrder & 0x3;
    TformOrder >>= 2;
    if (D == 3)
    {                      // next level
      if (TformOrder == 3) // next one is the last |
        TformOrder = PrevOrder;
      else
        PrevOrder = TformOrder;
      SetStrd(&G, S3);
      SetDims(&G, D3);
      R3 = D3;
      ++Level;
    }
    else
    {
      StackGrids[Iteration] = G;
      StackAxes[Iteration++] = D;
      R3[D] = D3[D] + IsEven(D3[D]);
      SetDims(&G, R3);
      D3[D] = (R3[D] + 1) >> 1;
      S3[D] <<= 1;
    }
  }

  /* inverse normalize if required */
  if (NLevels > 0 && Normalize)
  {
    idx2_Assert(IsFloatingPoint(Vol->Type));
    idx2_RAII(array<subband>, Subbands, BuildSubbands(Dims3, NLevels, TformOrder, &Subbands));
    auto BasisNorms = GetCdf53NormsFast<16>();
    for (int I = 0; I < Size(Subbands); ++I)
    {
      subband& S = Subbands[I];
      f64 Wx = Dims3.X == 1
                 ? 1
                 : (S.LowHigh3.X == 0 ? BasisNorms.ScalNorms[Iter * NLevels + S.Level3Rev.X - 1]
                                      : BasisNorms.WaveNorms[Iter * NLevels + S.Level3Rev.X]);
      f64 Wy = Dims3.Y == 1
                 ? 1
                 : (S.LowHigh3.Y == 0 ? BasisNorms.ScalNorms[Iter * NLevels + S.Level3Rev.Y - 1]
                                      : BasisNorms.WaveNorms[Iter * NLevels + S.Level3Rev.Y]);
      f64 Idx2 = Dims3.Z == 1
                   ? 1
                   : (S.LowHigh3.Z == 0 ? BasisNorms.ScalNorms[Iter * NLevels + S.Level3Rev.Z - 1]
                                        : BasisNorms.WaveNorms[Iter * NLevels + S.Level3Rev.Z]);
      f64 W = 1.0 / (Wx * Wy * Idx2);
#define Body(type)                                                                                 \
  auto ItEnd = End<type>(S.Grid, *Vol);                                                            \
  for (auto It = Begin<type>(S.Grid, *Vol); It != ItEnd; ++It)                                     \
    *It = type(*It * W);
      idx2_DispatchOnType(Vol->Type);
#undef Body
    }
  }

  /* perform the inverse transform */
  while (Iteration-- > 0)
  {
    int D = StackAxes[Iteration];
#define Body(type)                                                                                 \
  switch (D)                                                                                       \
  {                                                                                                \
    case 0:                                                                                        \
      ILiftCdf53X<f64>(StackGrids[Iteration], M3, lift_option::Normal, Vol);                       \
      break;                                                                                       \
    case 1:                                                                                        \
      ILiftCdf53Y<f64>(StackGrids[Iteration], M3, lift_option::Normal, Vol);                       \
      break;                                                                                       \
    case 2:                                                                                        \
      ILiftCdf53Z<f64>(StackGrids[Iteration], M3, lift_option::Normal, Vol);                       \
      break;                                                                                       \
    default:                                                                                       \
      idx2_Assert(false);                                                                          \
      break;                                                                                       \
  };
    idx2_DispatchOnType(Vol->Type);
#undef Body
  }
}